

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O0

void helper_crypto_aese_aarch64(void *vd,void *vm,uint32_t decrypt)

{
  int local_54;
  ulong uStack_50;
  int i;
  CRYPTO_STATE st;
  CRYPTO_STATE rk;
  uint64_t *rm;
  uint64_t *rd;
  void *pvStack_18;
  uint32_t decrypt_local;
  void *vm_local;
  void *vd_local;
  
  vm_local = vd;
  pvStack_18 = vm;
  rd._4_4_ = decrypt;
  rm = (uint64_t *)vd;
  rk.l[1] = (uint64_t)vm;
  st.l[1] = *vm;
  rk.l[0] = *(ulong *)((long)vm + 8);
  uStack_50 = *vd;
  st.l[0] = *(ulong *)((long)vd + 8);
  if (decrypt < 2) {
    st.l[1] = uStack_50 ^ st.l[1];
    rk.l[0] = st.l[0] ^ rk.l[0];
    for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
      *(uint8_t *)((long)&stack0xffffffffffffffb0 + (long)local_54) =
           helper_crypto_aese_aarch64::sbox[decrypt]
           [st.bytes[(ulong)helper_crypto_aese_aarch64::shift[decrypt][local_54] + 8]];
    }
    *(ulong *)vd = uStack_50;
    *(uint64_t *)((long)vd + 8) = st.l[0];
    return;
  }
  __assert_fail("decrypt < 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                ,0x2a,"void helper_crypto_aese_aarch64(void *, void *, uint32_t)");
}

Assistant:

void HELPER(crypto_aese)(void *vd, void *vm, uint32_t decrypt)
{
    static uint8_t const * const sbox[2] = { AES_sbox, AES_isbox };
    static uint8_t const * const shift[2] = { AES_shifts, AES_ishifts };
    uint64_t *rd = vd;
    uint64_t *rm = vm;
    union CRYPTO_STATE rk = { .l = { rm[0], rm[1] } };
    union CRYPTO_STATE st = { .l = { rd[0], rd[1] } };
    int i;

    assert(decrypt < 2);

    /* xor state vector with round key */
    rk.l[0] ^= st.l[0];
    rk.l[1] ^= st.l[1];

    /* combine ShiftRows operation and sbox substitution */
    for (i = 0; i < 16; i++) {
        CR_ST_BYTE(st, i) = sbox[decrypt][CR_ST_BYTE(rk, shift[decrypt][i])];
    }

    rd[0] = st.l[0];
    rd[1] = st.l[1];
}